

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tensor.hpp
# Opt level: O2

void __thiscall
scp::Tensor<std::complex<double>_>::_ndCooleyTukey
          (Tensor<std::complex<double>_> *this,complex<double> *beg,uint64_t order,
          complex<double> **bases)

{
  uint64_t uVar1;
  uint64_t *puVar2;
  unsigned_long __x;
  long lVar3;
  int iVar4;
  complex<double> *pcVar5;
  ulong n;
  uint64_t stride;
  uint64_t uVar6;
  ulong uVar7;
  bool bVar8;
  __type _Var9;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  factorsCopy;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  factors;
  
  uVar1 = (this->_shape).order;
  puVar2 = (this->_shape).sizes;
  lVar3 = order * -8;
  iVar4 = 1;
  while (lVar3 = lVar3 + 8, lVar3 != 0) {
    iVar4 = iVar4 * *(int *)((long)puVar2 + lVar3 + uVar1 * 8);
  }
  stride = (uint64_t)iVar4;
  if (order < 2) {
    n = puVar2[uVar1 - order];
  }
  else {
    pcVar5 = beg;
    for (uVar7 = 0; n = puVar2[uVar1 - order], uVar7 < n; uVar7 = uVar7 + 1) {
      _ndCooleyTukey(this,pcVar5,order - 1,bases);
      pcVar5 = pcVar5 + stride;
    }
  }
  if (1 < n) {
    pcVar5 = bases[(this->_shape).order - order];
    uVar6 = stride;
    if ((n & n - 1) == 0) {
      while (uVar6 != 0) {
        __x = puVar2[uVar1 - order];
        _Var9 = std::log2<unsigned_long>(__x);
        _scp::bitReversal<std::complex<double>>(beg,stride,__x,(uint8_t)(int)_Var9);
        _scp::cooleyTukeyRadix2<std::complex<double>>(beg,stride,pcVar5,1,puVar2[uVar1 - order]);
        beg = beg + 1;
        uVar6 = uVar6 - 1;
      }
    }
    else {
      factors.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      factors.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      factors.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      factorsCopy.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      factorsCopy.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      factorsCopy.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      primeFactors<unsigned_long>(n,&factors);
      while (bVar8 = uVar6 != 0, uVar6 = uVar6 - 1, bVar8) {
        std::
        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::operator=(&factorsCopy,&factors);
        _scp::cooleyTukey<std::complex<double>>
                  (beg,stride,pcVar5,1,puVar2[uVar1 - order],
                   factorsCopy.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (long)factorsCopy.
                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)factorsCopy.
                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4);
        beg = beg + 1;
      }
      std::
      _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::~_Vector_base(&factorsCopy.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     );
      std::
      _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::~_Vector_base(&factors.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     );
    }
  }
  return;
}

Assistant:

constexpr void Tensor<TValue>::_ndCooleyTukey(TValue* beg, uint64_t order, const TValue* const* bases)
	{
		const uint64_t& size = *(_shape.sizes + _shape.order - order);
		
		const uint64_t subLength = std::accumulate(_shape.sizes + _shape.order - order + 1, _shape.sizes + _shape.order, 1, std::multiplies<uint64_t>());
		
		if (order > 1)
		{
			for (uint64_t i = 0; i < size; ++i)
			{
				_ndCooleyTukey(beg + i * subLength, order - 1, bases);
			}
		}

		if (size > 1)
		{
			const TValue* base = bases[_shape.order - order];

			if ((size & (size - 1)) == 0)
			{
				for (uint64_t i = 0; i < subLength; ++i)
				{
					_scp::bitReversal(beg + i, subLength, size, std::log2(size));
					_scp::cooleyTukeyRadix2(beg + i, subLength, base, 1, size);
				}
			}
			else
			{
				std::vector<std::pair<uint64_t, uint64_t>> factors, factorsCopy;
				primeFactors(size, factors);

				for (uint64_t i = 0; i < subLength; ++i)
				{
					factorsCopy = factors;
					_scp::cooleyTukey(beg + i, subLength, base, 1, size, factorsCopy.data(), factorsCopy.size());
				}
			}
		}
	}